

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

basic_byte_string<std::allocator<unsigned_char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
as_byte_string<std::allocator<unsigned_char>>
          (basic_byte_string<std::allocator<unsigned_char>_> *__return_storage_ptr__,
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this)

{
  uchar *__first;
  semantic_tag tag;
  system_error *this_00;
  json_runtime_error<std::domain_error,_void> *this_01;
  error_code __ec;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
  converter;
  error_code ec;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
  local_49;
  error_code local_48;
  string local_38;
  
  local_38._M_string_length = (size_type)local_38._M_dataplus._M_p;
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  switch((byte)*this & 0xf) {
  case 7:
  case 0xf:
    local_38._0_16_ =
         basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_string_view
                   ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                    this);
    tag = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::tag
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this);
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
    ::convert<char>(__return_storage_ptr__,&local_49,
                    (basic_string_view<char,_std::char_traits<char>_> *)&local_38,tag,&local_48);
    if (local_48._M_value != 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x58);
      __ec._4_4_ = 0;
      __ec._M_value = local_48._M_value;
      *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b58738;
      __ec._M_cat = local_48._M_cat;
      std::system_error::system_error(this_00,__ec);
      *(undefined8 *)this_00 = 0xb586d8;
      *(undefined8 *)(this_00 + 0x50) = 0xb58710;
      *(undefined8 *)(this_00 + 0x20) = 0;
      *(undefined8 *)(this_00 + 0x28) = 0;
      *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
      *(undefined8 *)(this_00 + 0x38) = 0;
      this_00[0x40] = (system_error)0x0;
      __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
    }
    break;
  case 8:
  case 9:
    as_byte_string<std::allocator<unsigned_char>>
              (__return_storage_ptr__,
               *(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> **)
                (this + 8));
    break;
  default:
    this_01 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not a byte string","");
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_01,&local_38);
    __cxa_throw(this_01,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case 0xc:
    __first = *(uchar **)(*(long *)(this + 8) + 0x10);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first
               ,__first + *(long *)(*(long *)(this + 8) + 0x18),(allocator_type *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

basic_byte_string<BAllocator> as_byte_string() const
        {
            using byte_string_type = basic_byte_string<BAllocator>;
            std::error_code ec;

            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    value_converter<jsoncons::string_view, byte_string_type> converter;
                    byte_string_type v = converter.convert(as_string_view(),tag(), ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        JSONCONS_THROW(ser_error(ec));
                    }
                    return v;
                }
                case json_storage_kind::byte_str:
                    return basic_byte_string<BAllocator>(cast<byte_string_storage>().data(),cast<byte_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_byte_string();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_byte_string();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a byte string"));
            }
        }